

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O2

SimpleString __thiscall TestFailure::createUserText(TestFailure *this,SimpleString *text)

{
  bool bVar1;
  SimpleString *in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  SimpleString SVar3;
  SimpleString SStack_28;
  
  SimpleString::SimpleString((SimpleString *)this,"");
  bVar1 = SimpleString::isEmpty(in_RDX);
  sVar2 = extraout_RDX;
  if (!bVar1) {
    SimpleString::SimpleString(&SStack_28,"LONGS_EQUAL");
    bVar1 = SimpleString::startsWith(in_RDX,&SStack_28);
    SimpleString::~SimpleString(&SStack_28);
    if (!bVar1) {
      SimpleString::operator+=((SimpleString *)this,"Message: ");
    }
    SimpleString::operator+=((SimpleString *)this,in_RDX);
    SimpleString::operator+=((SimpleString *)this,"\n\t");
    sVar2 = extraout_RDX_00;
  }
  SVar3.bufferSize_ = sVar2;
  SVar3.buffer_ = (char *)this;
  return SVar3;
}

Assistant:

SimpleString TestFailure::createUserText(const SimpleString& text)
{
    SimpleString userMessage = "";
    if (!text.isEmpty())
    {
        //This is a kludge to turn off "Message: " for this case.
        //I don't think "Message: " adds anything, as you get to see the
        //message. I propose we remove "Message: " lead in
        if (!text.startsWith("LONGS_EQUAL"))
            userMessage += "Message: ";
        userMessage += text;
        userMessage += "\n\t";
    }
    return userMessage;
}